

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

shared_ptr<Jupiter::IRC::Client::User> __thiscall
Jupiter::IRC::Client::findUserOrAdd(Client *this,string_view in_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  bool bVar1;
  element_type *peVar2;
  pointer ppVar3;
  value_type in_CL;
  value_type in_delim;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string_view in_nickname;
  __sv_type _Var4;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false,_false>,_bool>
  pVar5;
  shared_ptr<Jupiter::IRC::Client::User> sVar6;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
  local_f8;
  undefined1 local_f0;
  undefined1 local_e8 [8];
  shared_ptr<Jupiter::IRC::Client::User> user;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  username_hostname;
  char *local_88;
  undefined1 local_78 [8];
  shared_ptr<Jupiter::IRC::Client::User> result;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  name_split;
  Client *this_local;
  string_view in_name_local;
  
  this_local = (Client *)in_name._M_str;
  in_nickname._M_len = in_name._M_len;
  __return_storage_ptr__ =
       &result.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  name_split.second.field_2._8_8_ = in_nickname._M_len;
  in_name_local._M_str = (char *)this;
  jessilib::split_once<,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)__return_storage_ptr__,(jessilib *)&this_local,
             (basic_string_view<char,_std::char_traits<char>_> *)0x21,in_CL);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)__return_storage_ptr__)
  ;
  local_88 = (char *)_Var4._M_len;
  in_delim = (value_type)_Var4._M_str;
  in_nickname._M_str = local_88;
  getUser((Client *)local_78,in_nickname);
  bVar1 = std::operator==((shared_ptr<Jupiter::IRC::Client::User> *)local_78,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    jessilib::split_once<,std::__cxx11::string>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&user.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,(jessilib *)(name_split.first.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40,in_delim);
    std::make_shared<Jupiter::IRC::Client::User>();
    peVar2 = std::
             __shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_e8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&peVar2->m_nickname,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &result.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar2 = std::
             __shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_e8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&peVar2->m_username,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &user.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar2 = std::
             __shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_e8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&peVar2->m_hostname,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&username_hostname.first.field_2 + 8));
    peVar2 = std::
             __shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_e8);
    pVar5 = std::
            unordered_map<std::__cxx11::string,std::shared_ptr<Jupiter::IRC::Client::User>,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>>>
            ::emplace<std::__cxx11::string&,std::shared_ptr<Jupiter::IRC::Client::User>&>
                      ((unordered_map<std::__cxx11::string,std::shared_ptr<Jupiter::IRC::Client::User>,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>>>
                        *)(in_nickname._M_len + 0x278),&peVar2->m_nickname,
                       (shared_ptr<Jupiter::IRC::Client::User> *)local_e8);
    local_f8._M_cur =
         (__node_type *)
         pVar5.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
         ._M_cur;
    local_f0 = pVar5.second;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false,_false>
                           *)&local_f8);
    std::shared_ptr<Jupiter::IRC::Client::User>::shared_ptr
              ((shared_ptr<Jupiter::IRC::Client::User> *)this,&ppVar3->second);
    username_hostname.second.field_2._8_4_ = 1;
    std::shared_ptr<Jupiter::IRC::Client::User>::~shared_ptr
              ((shared_ptr<Jupiter::IRC::Client::User> *)local_e8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&user.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    std::shared_ptr<Jupiter::IRC::Client::User>::shared_ptr
              ((shared_ptr<Jupiter::IRC::Client::User> *)this,
               (shared_ptr<Jupiter::IRC::Client::User> *)local_78);
    username_hostname.second.field_2._8_4_ = 1;
  }
  std::shared_ptr<Jupiter::IRC::Client::User>::~shared_ptr
            ((shared_ptr<Jupiter::IRC::Client::User> *)local_78);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&result.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar6.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar6.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Jupiter::IRC::Client::User>)
         sVar6.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Jupiter::IRC::Client::User> Jupiter::IRC::Client::findUserOrAdd(std::string_view in_name) {
	// in_name: Nickname!Username@Hostname
	// Assume: Nickname can contain anything but !
	// Assume: Username can contain anything but @
	// Assume: Hostname can contain anything
	auto name_split = jessilib::split_once(in_name, '!');

	auto result = getUser(name_split.first);
	if (result != nullptr) {
		return result;
	}

	auto username_hostname = jessilib::split_once(name_split.second, '@');

	auto user = std::make_shared<User>();
	user->m_nickname = name_split.first;
	user->m_username = username_hostname.first;
	user->m_hostname = username_hostname.second;
	return m_users.emplace(user->m_nickname, user).first->second;
}